

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O2

void __thiscall
cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache(cbtSortedOverlappingPairCache *this)

{
  (this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
  _vptr_cbtOverlappingPairCallback = (_func_int **)&PTR__cbtSortedOverlappingPairCache_01193488;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (cbtBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_blockedForChanges = false;
  this->m_hasDeferredRemoval = true;
  this->m_overlapFilterCallback = (cbtOverlapFilterCallback *)0x0;
  this->m_ghostPairCallback = (cbtOverlappingPairCallback *)0x0;
  cbtAlignedObjectArray<cbtBroadphasePair>::reserve(&this->m_overlappingPairArray,2);
  return;
}

Assistant:

cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache() : m_blockedForChanges(false),
															   m_hasDeferredRemoval(true),
															   m_overlapFilterCallback(0),
															   m_ghostPairCallback(0)
{
	int initialAllocatedSize = 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}